

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

void __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::Required<reflection::EnumVal>
          (FlatBufferBuilderImpl<false> *this,Offset<reflection::EnumVal> table,voffset_t field)

{
  int *piVar1;
  
  piVar1 = (int *)((this->buf_).buf_ + ((this->buf_).reserved_ - (ulong)table.o));
  if ((field < *(ushort *)((long)piVar1 - (long)*piVar1)) &&
     (*(short *)((long)piVar1 + ((ulong)field - (long)*piVar1)) != 0)) {
    return;
  }
  __assert_fail("ok",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                ,0x1f1,
                "void flatbuffers::FlatBufferBuilderImpl<>::Required(Offset<T>, voffset_t) [Is64Aware = false, T = reflection::EnumVal]"
               );
}

Assistant:

void Required(Offset<T> table, voffset_t field) {
    auto table_ptr = reinterpret_cast<const Table *>(buf_.data_at(table.o));
    bool ok = table_ptr->GetOptionalFieldOffset(field) != 0;
    // If this fails, the caller will show what field needs to be set.
    FLATBUFFERS_ASSERT(ok);
    (void)ok;
  }